

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O2

void accumulate(int *xs,int *ys,size_t n,inform_dist *x,inform_dist *y)

{
  size_t i;
  size_t sVar1;
  
  x->counts = n;
  y->counts = n;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    x->histogram[xs[sVar1]] = x->histogram[xs[sVar1]] + 1;
    y->histogram[ys[sVar1]] = y->histogram[ys[sVar1]] + 1;
  }
  return;
}

Assistant:

inline static void accumulate(int const *series, size_t l, size_t n,
    int const *b, inform_dist *joint, inform_dist **marginals)
{
    joint->counts = n;
    for (size_t i = 0; i < l; ++i)
    {
        marginals[i]->counts = n;
    }

    for (size_t i = 0; i < n; ++i)
    {
        size_t joint_event = 0;
        for (size_t j = 0; j < l; ++j)
        {
            joint_event = joint_event * b[j] + series[i + n * j];
            marginals[j]->histogram[series[i + n * j]]++;
        }
        joint->histogram[joint_event]++;
    }
}